

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O3

ostream * Indexing::operator<<
                    (ostream *out,
                    SubstitutionTree<Inferences::ALASCA::FourierMotzkinConf::Rhs> *self)

{
  Node *pNVar1;
  
  pNVar1 = self->_root;
  if (pNVar1 == (Node *)0x0) {
    std::__ostream_insert<char,std::char_traits<char>>(out,"<empty tree>",0xc);
  }
  else {
    (*pNVar1->_vptr_Node[7])(pNVar1,out,0,0);
  }
  return out;
}

Assistant:

std::ostream& operator<<(std::ostream& out, SubstitutionTree<LeafData_> const& self)
  {
#if VERBOSE_OUTPUT_OPERATORS
    out << "{ nextVar: S" << self._nextVar << ", root: (";
#endif // VERBOSE_OUTPUT_OPERATORS
    if (self._root) {
      out << *self._root;
    } else {
      out << "<empty tree>";
    }
#if VERBOSE_OUTPUT_OPERATORS
    out << ") }";
#endif // VERBOSE_OUTPUT_OPERATORS
    return out;
  }